

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,double&,double&>
          (pybind11 *this,double *args_,double *args__1)

{
  double dVar1;
  PyTypeObject *pPVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  handle *this_00;
  cast_error *this_01;
  reference __rhs;
  PyObject **ppPVar7;
  handle local_130;
  iterator local_128;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range2;
  int counter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0;
  undefined1 local_b8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  size_t i;
  PyObject *local_68;
  handle local_50;
  PyObject *local_48;
  pybind11 *local_40;
  undefined1 local_38 [8];
  array<pybind11::object,_2UL> args;
  size_t size;
  double *args__local_1;
  double *args__local;
  tuple *result;
  
  args._M_elems[1].super_handle.m_ptr = (handle)(PyObject *)0x2;
  dVar1 = *args_;
  local_40 = (pybind11 *)local_38;
  handle::handle(&local_50,(PyObject *)0x0);
  local_48 = (PyObject *)
             detail::type_caster<double,_void>::cast<double>(dVar1,automatic_reference,local_50);
  reinterpret_steal<pybind11::object>((pybind11 *)local_38,(handle)local_48);
  dVar1 = *args__1;
  local_40 = (pybind11 *)&args;
  handle::handle((handle *)&i,(PyObject *)0x0);
  local_68 = (PyObject *)
             detail::type_caster<double,_void>::cast<double>(dVar1,automatic_reference,(handle)i);
  reinterpret_steal<pybind11::object>((pybind11 *)&args,(handle)local_68);
  argtypes._M_elems[1].field_2._8_8_ = 0;
  while( true ) {
    uVar3 = argtypes._M_elems[1].field_2._8_8_;
    sVar6 = std::array<pybind11::object,_2UL>::size((array<pybind11::object,_2UL> *)local_38);
    if (sVar6 <= (ulong)uVar3) {
      __range2._6_1_ = 0;
      tuple::tuple((tuple *)this,2);
      __range2._0_4_ = 0;
      __begin0 = (iterator)local_38;
      __end0 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)__begin0);
      arg_value = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)__begin0);
      while( true ) {
        if (__end0 == arg_value) {
          __range2._6_1_ = 1;
          std::array<pybind11::object,_2UL>::~array((array<pybind11::object,_2UL> *)local_38);
          return (object)(object)this;
        }
        local_128 = __end0;
        local_130 = object::release(__end0);
        ppPVar7 = handle::ptr(&local_130);
        pPVar2 = (PyTypeObject *)*ppPVar7;
        ppPVar7 = handle::ptr((handle *)this);
        iVar5 = PyType_HasFeature((*ppPVar7)->ob_type,0x4000000);
        if (iVar5 == 0) break;
        ppPVar7 = handle::ptr((handle *)this);
        (&(*ppPVar7)[1].ob_type)[(int)__range2] = pPVar2;
        __end0 = __end0 + 1;
        __range2._0_4_ = (int)__range2 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/cast.h"
                    ,0x6ee,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <double &, double &>]"
                   );
    }
    this_00 = &std::array<pybind11::object,_2UL>::operator[]
                         ((array<pybind11::object,_2UL> *)local_38,
                          argtypes._M_elems[1].field_2._8_8_)->super_handle;
    bVar4 = handle::operator_cast_to_bool(this_00);
    if (!bVar4) break;
    argtypes._M_elems[1].field_2._8_8_ = argtypes._M_elems[1].field_2._8_8_ + 1;
  }
  local_c0 = local_b8;
  type_id<double&>();
  local_c0 = (undefined1 *)((long)&argtypes._M_elems[0].field_2 + 8);
  type_id<double&>();
  __range2._7_1_ = 1;
  this_01 = (cast_error *)__cxa_allocate_exception(0x10);
  __rhs = std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                        *)local_b8,argtypes._M_elems[1].field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&counter,
                 "make_tuple(): unable to convert argument of type \'",__rhs);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&counter,
                 "\' to Python object");
  cast_error::runtime_error(this_01,&local_e0);
  __range2._7_1_ = 0;
  __cxa_throw(this_01,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}